

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

ON_Xform * __thiscall ON_Xform::operator=(ON_Xform *this,ON_Matrix *src)

{
  int local_38;
  int local_34;
  int maxj;
  int maxi;
  int j;
  int i;
  ON_Matrix *src_local;
  ON_Xform *this_local;
  
  local_34 = ON_Matrix::RowCount(src);
  if (4 < local_34) {
    local_34 = 4;
  }
  local_38 = ON_Matrix::ColCount(src);
  if (4 < local_38) {
    local_38 = 4;
  }
  memcpy(this,&IdentityTransformation,0x80);
  for (maxi = 0; maxi < local_34; maxi = maxi + 1) {
    for (maxj = 0; maxj < local_38; maxj = maxj + 1) {
      this->m_xform[maxi][maxj] = src->m[maxi][maxj];
    }
  }
  return this;
}

Assistant:

ON_Xform& ON_Xform::operator=(const ON_Matrix& src)
{
  int i,j;
  i = src.RowCount();
  const int maxi = (i>4)?4:i;
  j = src.ColCount();
  const int maxj = (j>4)?4:j;
  *this = ON_Xform::IdentityTransformation;
  for ( i = 0; i < maxi; i++ ) for ( j = 0; j < maxj; j++ ) {
    m_xform[i][j] = src.m[i][j];
  }
  return *this;
}